

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QFlags<Qt::AlignmentFlag>_>::erase
          (QPodArrayOps<QFlags<Qt::AlignmentFlag>_> *this,QFlags<Qt::AlignmentFlag> *b,qsizetype n)

{
  QFlags<Qt::AlignmentFlag> *__src;
  QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *pQVar1;
  QFlags<Qt::AlignmentFlag> *pQVar2;
  long in_RDX;
  QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *in_RSI;
  long in_RDI;
  QFlags<Qt::AlignmentFlag> *e;
  QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *in_stack_ffffffffffffffb0;
  
  __src = (QFlags<Qt::AlignmentFlag> *)((long)&in_RSI->d + in_RDX * 4);
  pQVar1 = (QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *)
           QArrayDataPointer<QFlags<Qt::AlignmentFlag>_>::begin
                     ((QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *)0x8b5026);
  if ((in_RSI == pQVar1) &&
     (pQVar2 = QArrayDataPointer<QFlags<Qt::AlignmentFlag>_>::end(in_stack_ffffffffffffffb0),
     __src != pQVar2)) {
    *(QFlags<Qt::AlignmentFlag> **)(in_RDI + 8) = __src;
  }
  else {
    pQVar2 = QArrayDataPointer<QFlags<Qt::AlignmentFlag>_>::end(in_stack_ffffffffffffffb0);
    if (__src != pQVar2) {
      pQVar2 = QArrayDataPointer<QFlags<Qt::AlignmentFlag>_>::end(in_RSI);
      memmove(in_RSI,__src,((long)pQVar2 - (long)__src >> 2) << 2);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }